

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O1

OutputDescriptorResponseStruct *
cfd::js::api::ElementsAddressStructApi::AppendDescriptorChecksum
          (OutputDescriptorResponseStruct *__return_storage_ptr__,
          AppendDescriptorChecksumRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  _Rb_tree_header *p_Var2;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  _Any_data local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->descriptor)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->descriptor).field_2;
  (__return_storage_ptr__->descriptor)._M_string_length = 0;
  (__return_storage_ptr__->descriptor).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var2 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = 0;
  local_128._8_8_ =
       std::
       _Function_handler<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:274:20)>
       ::_M_invoke;
  local_128._0_8_ =
       std::
       _Function_handler<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:274:20)>
       ::_M_manager;
  local_118._M_unused._M_object = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"AppendDescriptorChecksum","");
  ExecuteStructApi<cfd::js::api::AppendDescriptorChecksumRequestStruct,cfd::js::api::OutputDescriptorResponseStruct>
            ((OutputDescriptorResponseStruct *)local_f8,(api *)request,
             (AppendDescriptorChecksumRequestStruct *)local_138,
             (function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
              *)&local_118,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
  (__return_storage_ptr__->error).code = local_f8._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_90._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((undefined1 *)local_118._M_unused._0_8_ != local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  if ((code *)local_128._0_8_ != (code *)0x0) {
    (*(code *)local_128._0_8_)(local_138,local_138,3);
  }
  return __return_storage_ptr__;
}

Assistant:

OutputDescriptorResponseStruct
ElementsAddressStructApi::AppendDescriptorChecksum(
    const AppendDescriptorChecksumRequestStruct& request) {
  auto call_func = [](const AppendDescriptorChecksumRequestStruct& request)
      -> OutputDescriptorResponseStruct {  // NOLINT
    OutputDescriptorResponseStruct response;

    Descriptor descriptor = Descriptor::ParseElements(request.descriptor);

    response.descriptor = descriptor.ToString();
    return response;
  };

  OutputDescriptorResponseStruct result;
  result = ExecuteStructApi<
      AppendDescriptorChecksumRequestStruct, OutputDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}